

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleIni.h
# Opt level: O0

bool __thiscall
SI_ConvertA<char>::ConvertToStore
          (SI_ConvertA<char> *this,char *a_pInputData,char *a_pOutputData,size_t a_uOutputDataSize)

{
  size_t sVar1;
  ulong __n;
  size_t uInputLen;
  size_t a_uOutputDataSize_local;
  char *a_pOutputData_local;
  char *a_pInputData_local;
  SI_ConvertA<char> *this_local;
  
  sVar1 = strlen(a_pInputData);
  __n = sVar1 + 1;
  if (__n <= a_uOutputDataSize) {
    memcpy(a_pOutputData,a_pInputData,__n);
  }
  return __n <= a_uOutputDataSize;
}

Assistant:

bool ConvertToStore(
        const SI_CHAR * a_pInputData,
        char *          a_pOutputData,
        size_t          a_uOutputDataSize)
    {
        // calc input string length (SI_CHAR type and size independent)
        size_t uInputLen = strlen((const char *)a_pInputData) + 1;
        if (uInputLen > a_uOutputDataSize) {
            return false;
        }

        // ascii/UTF-8 needs no conversion
        memcpy(a_pOutputData, a_pInputData, uInputLen);
        return true;
    }